

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O0

void Color::print_info(string *out,bool important)

{
  byte bVar1;
  ostream *poVar2;
  byte in_SIL;
  string *in_RDI;
  Modifier reset;
  Modifier bold;
  Modifier green;
  Modifier *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  Modifier::Modifier((Modifier *)&stack0xfffffffffffffff0,FG_GREEN);
  Modifier::Modifier((Modifier *)&stack0xffffffffffffffec,BOLD);
  Modifier::Modifier((Modifier *)&stack0xffffffffffffffe8,RESET);
  if ((bVar1 & 1) == 0) {
    poVar2 = operator<<((ostream *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffe8);
    std::operator<<(poVar2,"[------------] ");
    poVar2 = operator<<((ostream *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffe8);
    poVar2 = std::operator<<(poVar2,in_RDI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    operator<<((ostream *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    poVar2 = operator<<((ostream *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffe8);
    poVar2 = std::operator<<(poVar2,"[------------] ");
    std::operator<<(poVar2,in_RDI);
    poVar2 = operator<<((ostream *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        in_stack_ffffffffffffffe8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void print_info(const std::string &out, bool important = false) {
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  if (!important) {
    std::cout << green << "[------------] " << reset << out << std::endl;
  } else {
    std::cout << green << bold << "[------------] " << out << reset << std::endl;
  }
}